

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O2

uint32 dumbfile_cgetul(DUMBFILE *f)

{
  uint uVar1;
  uint32 rv;
  uint uVar2;
  
  uVar2 = 0;
  do {
    uVar1 = dumbfile_getc(f);
    if ((int)uVar1 < 0) {
      return uVar1;
    }
    uVar2 = uVar2 << 7 | uVar1 & 0x7f;
  } while ((char)uVar1 < '\0');
  return uVar2;
}

Assistant:

uint32 DUMBEXPORT dumbfile_cgetul(DUMBFILE *f)
{
	uint32 rv = 0;
	int v;

	do {
		v = dumbfile_getc(f);

		if (v < 0)
			return v;

		rv <<= 7;
		rv |= v & 0x7F;
	} while (v & 0x80);

	return rv;
}